

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O3

MESSAGE_RECEIVER_HANDLE
messagereceiver_create
          (LINK_HANDLE link,ON_MESSAGE_RECEIVER_STATE_CHANGED on_message_receiver_state_changed,
          void *context)

{
  MESSAGE_RECEIVER_HANDLE pMVar1;
  LOGGER_LOG p_Var2;
  
  pMVar1 = (MESSAGE_RECEIVER_HANDLE)calloc(1,0x40);
  if (pMVar1 == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                ,"messagereceiver_create",0x145,1,"Error creating message receiver");
    }
  }
  else {
    pMVar1->link = link;
    pMVar1->on_message_receiver_state_changed = on_message_receiver_state_changed;
    pMVar1->on_message_receiver_state_changed_context = context;
    pMVar1->message_receiver_state = MESSAGE_RECEIVER_STATE_IDLE;
  }
  return pMVar1;
}

Assistant:

MESSAGE_RECEIVER_HANDLE messagereceiver_create(LINK_HANDLE link, ON_MESSAGE_RECEIVER_STATE_CHANGED on_message_receiver_state_changed, void* context)
{
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)calloc(1, sizeof(MESSAGE_RECEIVER_INSTANCE));
    if (message_receiver == NULL)
    {
        LogError("Error creating message receiver");
    }
    else
    {
        message_receiver->link = link;
        message_receiver->on_message_receiver_state_changed = on_message_receiver_state_changed;
        message_receiver->on_message_receiver_state_changed_context = context;
        message_receiver->message_receiver_state = MESSAGE_RECEIVER_STATE_IDLE;
    }

    return message_receiver;
}